

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * __thiscall
CMU462::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  double *pdVar1;
  int i;
  long lVar2;
  int k;
  long lVar3;
  Vector3D *pVVar4;
  long lVar5;
  Vector3D *pVVar6;
  double dVar7;
  
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  lVar2 = 0;
  do {
    lVar5 = 0;
    pVVar4 = B->entries;
    do {
      pdVar1 = &__return_storage_ptr__->entries[lVar5].x + lVar2;
      *pdVar1 = 0.0;
      dVar7 = 0.0;
      lVar3 = 0;
      pVVar6 = this->entries;
      do {
        dVar7 = dVar7 + ((Vector3D *)&pVVar6->x)->x * (&((Vector3D *)&pVVar4->x)->x)[lVar3];
        lVar3 = lVar3 + 1;
        pVVar6 = pVVar6 + 1;
      } while (lVar3 != 3);
      *pdVar1 = dVar7;
      lVar5 = lVar5 + 1;
      pVVar4 = pVVar4 + 1;
    } while (lVar5 != 3);
    lVar2 = lVar2 + 1;
    this = (Matrix3x3 *)&this->entries[0].y;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = 0.;

       for( int k = 0; k < 3; k++ )
       {
          C(i,j) += A(i,k)*B(k,j);
       }
    }

    return C;
  }